

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O2

void __thiscall
Hospital::Show_Specific_Staff
          (Hospital *this,vector<Nurse,_std::allocator<Nurse>_> *All_Of_Nurses,string *id)

{
  pointer pNVar1;
  __type _Var2;
  ostream *poVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  for (uVar4 = 0;
      pNVar1 = (All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar4 < (ulong)(((long)(All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)pNVar1) / 0x158);
      uVar4 = uVar4 + 1) {
    Nurse::nurse_all_ino_getter_abi_cxx11_(&local_48,pNVar1 + uVar4);
    _Var2 = std::operator==(local_48.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,id);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    if (_Var2) {
      lVar5 = 0;
      uVar7 = 0;
      while( true ) {
        Nurse::nurse_all_ino_getter_abi_cxx11_
                  (&local_48,
                   (All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
                   super__Vector_impl_data._M_start + uVar4);
        lVar6 = (long)local_48.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_48.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_48);
        if ((ulong)(lVar6 >> 5) <= uVar7) break;
        Nurse::nurse_all_ino_getter_abi_cxx11_
                  (&local_48,
                   (All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
                   super__Vector_impl_data._M_start + uVar4);
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 (string *)
                                 ((long)&((local_48.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar5));
        std::endl<char,std::char_traits<char>>(poVar3);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_48);
        uVar7 = uVar7 + 1;
        lVar5 = lVar5 + 0x20;
      }
    }
  }
  return;
}

Assistant:

void Hospital:: Show_Specific_Staff(vector<Nurse> All_Of_Nurses , string id){
    for (int i = 0; i <All_Of_Nurses.size() ; ++i) {
        if (All_Of_Nurses[i].nurse_all_ino_getter()[0]==id){
            for (int j = 0; j <All_Of_Nurses[i].nurse_all_ino_getter().size() ; ++j) {
                cout <<All_Of_Nurses[i].nurse_all_ino_getter()[j]<<endl;
            }
        }
    }
}